

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void shieldeff(xchar x,xchar y)

{
  int iVar1;
  bool bVar2;
  
  if (('\0' < flags.sparkle) && ((viz_array[y][x] & 2U) != 0)) {
    bVar2 = (int)x - 1U < 0x4f;
    iVar1 = 0;
    do {
      if ((byte)y < 0x15 && bVar2) {
        dbuf[(byte)y][(uint)(int)x].effect = shield_static[iVar1] + 1U | 0x40000;
      }
      flush_screen();
      (*windowprocs.win_delay)();
      iVar1 = iVar1 + flags.sparkle;
    } while (iVar1 < 0x15);
    if ((byte)y < 0x15 && bVar2) {
      dbuf[(byte)y][(uint)(int)x].effect = 0;
    }
  }
  return;
}

Assistant:

void shieldeff(xchar x, xchar y)
{
    int i;

    if (flags.sparkle <= 0)
	return;

    if (cansee(x,y)) {	/* Don't see anything if can't see the location */
	for (i = 0; i < SHIELD_COUNT; i += flags.sparkle) {
	    dbuf_set_effect(x, y, dbuf_effect(E_MISC, shield_static[i]));
	    flush_screen();	/* make sure the effect shows up */
	    win_delay_output();
	}

	dbuf_set_effect(x, y, 0);
    }
}